

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTrans.h
# Opt level: O1

void __thiscall ModelTrans::PyrDown(ModelTrans *this,char *pImage,char *dst,int width,int height)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  
  if (0 < height) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      if (0 < width) {
        lVar1 = uVar4 + (ulong)(uint)(width * 2) + 2;
        lVar2 = uVar4 + (ulong)(uint)width + 2;
        lVar5 = 0;
        pcVar6 = dst;
        do {
          *pcVar6 = (char)(int)((float)(int)pImage[lVar5 + lVar1] * 0.0 +
                               (float)(int)pImage[lVar5 + lVar1 + -1] * 0.0 +
                               (float)(int)pImage[lVar5 + lVar1 + -2] * 0.0 +
                               (float)(int)pImage[lVar5 + lVar2] * 0.0 +
                               (float)(int)pImage[lVar5 + lVar2 + -1] +
                               (float)(int)pImage[lVar5 + lVar2 + -2] * 0.0 +
                               (float)(int)pImage[lVar5 + uVar4 + 2] * 0.0 +
                               (float)(int)pImage[lVar5 + uVar4] * 0.0 +
                               (float)((uint)(float)(int)pImage[lVar5 + uVar4 + 1] & 0x80000000));
          lVar5 = lVar5 + 3;
          pcVar6 = pcVar6 + 1;
        } while (lVar5 < width);
      }
      uVar3 = uVar3 + 3;
      uVar4 = (ulong)(uint)((int)uVar4 + width * 3);
      dst = dst + width / 3;
    } while (uVar3 < (uint)height);
  }
  return;
}

Assistant:

void ModelTrans::PyrDown(char* pImage,char* dst, int width = 72, int height = 144)
{
    int newWidth = width/3;
    int curIndex = 0;
    for(int i = 0; i < height; i += 3)
    {
        curIndex = i*width;
        for(int j = 0; j < width; j += 3)
        {
            dst[(i/3)*newWidth + j/3] = pImage[curIndex]*pryDownKernel[0][0] + pImage[curIndex + 1]*pryDownKernel[0][1] +
                                        pImage[curIndex + 2]*pryDownKernel[0][2] + pImage[curIndex + width]*pryDownKernel[1][0] + pImage[curIndex + width + 1]*pryDownKernel[1][1] +
                                        pImage[curIndex + width + 2]*pryDownKernel[1][2] + pImage[curIndex + 2*width]*pryDownKernel[2][0] + pImage[curIndex + 2*width + 1]*pryDownKernel[2][1]+
                                        pImage[curIndex + 2*width + 2]*pryDownKernel[2][2];
            curIndex += 3;
        }
    }
}